

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioNativeStandardFile.cpp
# Opt level: O0

StandardFileCommon *
chatra::emb::io::StandardFileSystem::doOpenFile(string *fileName,Type_conflict flags)

{
  int *piVar1;
  char *pcVar2;
  IllegalArgumentException *pIVar3;
  undefined8 uVar4;
  string *psVar5;
  string local_c8;
  size_t local_a8;
  size_t length_1;
  FILE *fp_2;
  string local_90;
  FILE *local_70;
  FILE *fp_1;
  string local_60;
  size_t local_40;
  size_t length;
  FILE *local_28;
  FILE *fp;
  string *psStack_18;
  Type_conflict flags_local;
  string *fileName_local;
  
  fp._4_4_ = flags;
  psStack_18 = fileName;
  if (((flags & 2) == 0) || ((flags & 4) == 0)) {
    if ((flags & 2) == 0) {
      if ((flags & 1) == 0) {
        pIVar3 = (IllegalArgumentException *)__cxa_allocate_exception(0x28);
        memset(pIVar3,0,0x28);
        IllegalArgumentException::IllegalArgumentException(pIVar3);
        __cxa_throw(pIVar3,&IllegalArgumentException::typeinfo,
                    IllegalArgumentException::~IllegalArgumentException);
      }
      pcVar2 = (char *)std::__cxx11::string::data();
      length_1 = (size_t)fopen(pcVar2,"rb");
      local_a8 = getFileLengthOrClose(fileName,(FILE *)length_1);
      psVar5 = (string *)operator_new(0x48);
      std::__cxx11::string::string((string *)&local_c8,(string *)fileName);
      ReadStandardFile::StandardFileCommon
                ((ReadStandardFile *)psVar5,&local_c8,fp._4_4_,(FILE *)length_1,local_a8);
      fileName_local = psVar5;
      std::__cxx11::string::~string((string *)&local_c8);
    }
    else {
      pcVar2 = (char *)std::__cxx11::string::data();
      local_70 = fopen(pcVar2,"wb");
      psVar5 = (string *)operator_new(0x48);
      fp_2._7_1_ = 1;
      std::__cxx11::string::string((string *)&local_90,(string *)fileName);
      WriteStandardFile::WriteStandardFile
                ((WriteStandardFile *)psVar5,&local_90,fp._4_4_,(FILE *)local_70,0,false);
      fp_2._7_1_ = 0;
      fileName_local = psVar5;
      std::__cxx11::string::~string((string *)&local_90);
    }
  }
  else {
    piVar1 = __errno_location();
    *piVar1 = 0;
    pcVar2 = (char *)std::__cxx11::string::data();
    local_28 = fopen(pcVar2,"r+b");
    if (local_28 == (FILE *)0x0) {
      piVar1 = __errno_location();
      if (*piVar1 == 2) {
        pcVar2 = (char *)std::__cxx11::string::data();
        local_28 = fopen(pcVar2,"wb");
      }
    }
    if (local_28 == (FILE *)0x0) {
      pIVar3 = (IllegalArgumentException *)__cxa_allocate_exception(0x28);
      uVar4 = std::__cxx11::string::data();
      IllegalArgumentException::IllegalArgumentException(pIVar3,"cannot open file: %s",uVar4);
      __cxa_throw(pIVar3,&IllegalArgumentException::typeinfo,
                  IllegalArgumentException::~IllegalArgumentException);
    }
    local_40 = getFileLengthOrClose(fileName,(FILE *)local_28);
    psVar5 = (string *)operator_new(0x48);
    fp_1._7_1_ = 1;
    std::__cxx11::string::string((string *)&local_60,(string *)fileName);
    WriteStandardFile::WriteStandardFile
              ((WriteStandardFile *)psVar5,&local_60,fp._4_4_,(FILE *)local_28,local_40,true);
    fp_1._7_1_ = 0;
    fileName_local = psVar5;
    std::__cxx11::string::~string((string *)&local_60);
  }
  return (StandardFileCommon *)fileName_local;
}

Assistant:

static StandardFileCommon *doOpenFile(std::string fileName, FileOpenFlags::Type flags) {
		if ((flags & FileOpenFlags::Write) && (flags & FileOpenFlags::Append)) {
			errno = 0;
			auto fp = std::fopen(fileName.data(), "r+b");
			if (fp == nullptr && errno == ENOENT)
				fp = std::fopen(fileName.data(), "wb");
			if (fp == nullptr)
				throw IllegalArgumentException("cannot open file: %s", fileName.data());

			size_t length = getFileLengthOrClose(fileName, fp);
			return new WriteStandardFile(std::move(fileName), flags, fp, length, true);
		}
		else if (flags & FileOpenFlags::Write) {
			auto fp = std::fopen(fileName.data(), "wb");
			return new WriteStandardFile(std::move(fileName), flags, fp, 0, false);
		}
		else if (flags & FileOpenFlags::Read) {
			auto fp = std::fopen(fileName.data(), "rb");
			size_t length = getFileLengthOrClose(fileName, fp);
			return new ReadStandardFile(std::move(fileName), flags, fp, length);
		}
		else
			throw IllegalArgumentException();
	}